

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ValueFlag<unsigned_long,_args::ValueReader<unsigned_long>_>::ParseValue
          (ValueFlag<unsigned_long,_args::ValueReader<unsigned_long>_> *this,string *value_)

{
  ValueReader<unsigned_long>::operator()
            ((ValueReader<unsigned_long> *)&this->field_0xd0,
             &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,value_,&this->value);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }